

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeObjLit * __thiscall
Parser::CreateObjectPatternNode
          (Parser *this,ParseNodePtr pnodeMemberList,charcount_t ichMin,charcount_t ichLim,
          bool convertToPattern)

{
  code *pcVar1;
  anon_class_48_6_2b1b69a8 handler;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeType *pPVar4;
  ParseNodePtr local_80;
  ParseNodeObjLit *objectPatternNode;
  ParseNodePtr local_38;
  ParseNodePtr pnodeMemberNodeList;
  uint uStack_28;
  bool hasRest;
  uint32 computedCount;
  uint32 staticCount;
  charcount_t cStack_1c;
  bool convertToPattern_local;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  ParseNodePtr pnodeMemberList_local;
  Parser *this_local;
  
  uStack_28 = 0;
  pnodeMemberNodeList._4_4_ = 0;
  pnodeMemberNodeList._3_1_ = 0;
  local_80 = pnodeMemberList;
  if (convertToPattern) {
    local_80 = (ParseNodePtr)0x0;
  }
  local_38 = local_80;
  computedCount._3_1_ = convertToPattern;
  staticCount = ichLim;
  cStack_1c = ichMin;
  _ichLim_local = pnodeMemberList;
  pnodeMemberList_local = (ParseNodePtr)this;
  if (pnodeMemberList != (ParseNodePtr)0x0) {
    if (((pnodeMemberList->nop != knopList) &&
        (((convertToPattern || (pnodeMemberList->nop != knopObjectPatternMember)) &&
         (!convertToPattern)))) && (pnodeMemberList->nop != knopEllipsis)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x4c4,
                         "(pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis)"
                         ,
                         "pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    handler.this = this;
    handler.convertToPattern = (bool *)((long)&computedCount + 3);
    handler.pnodeMemberNodeList = &local_38;
    handler.computedCount = (uint32 *)((long)&pnodeMemberNodeList + 4);
    handler.staticCount = &stack0xffffffffffffffd8;
    handler.hasRest = (bool *)((long)&pnodeMemberNodeList + 3);
    ForEachItemInList<Parser::CreateObjectPatternNode(ParseNode*,unsigned_int,unsigned_int,bool)::__0>
              (_ichLim_local,handler);
  }
  pPVar4 = CreateNodeForOpT<(OpCode)112>(this,cStack_1c,staticCount);
  (pPVar4->super_ParseNodeUni).pnode1 = local_38;
  pPVar4->computedCount = pnodeMemberNodeList._4_4_;
  pPVar4->staticCount = uStack_28;
  pPVar4->hasRest = (bool)(pnodeMemberNodeList._3_1_ & 1);
  return pPVar4;
}

Assistant:

ParseNodeObjLit * Parser::CreateObjectPatternNode(ParseNodePtr pnodeMemberList, charcount_t ichMin, charcount_t ichLim, bool convertToPattern) {
    // Count the number of non-rest members in the object
    uint32 staticCount = 0;
    uint32 computedCount = 0;
    bool hasRest = false;
    ParseNodePtr pnodeMemberNodeList = convertToPattern ? nullptr : pnodeMemberList;
    if (pnodeMemberList != nullptr)
    {
        Assert(pnodeMemberList->nop == knopList || 
              (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || 
              convertToPattern ||
              pnodeMemberList->nop == knopEllipsis);
        ForEachItemInList(pnodeMemberList, [&](ParseNodePtr item) {
            ParseNodePtr memberNode = convertToPattern ? ConvertMemberToMemberPattern(item) : item;
            if (convertToPattern)
            {
                AppendToList(&pnodeMemberNodeList, memberNode);
            }
            if (memberNode->nop != knopEllipsis)
            {
                ParseNodePtr nameNode = memberNode->AsParseNodeBin()->pnode1;
                Assert(nameNode->nop == knopComputedName || nameNode->nop == knopStr);
                if (nameNode->nop == knopComputedName)
                {
                    computedCount++;
                }
                else
                {
                    staticCount++;
                }
            }
            else
            {
                hasRest = true;
            }
        });
    }

    ParseNodeObjLit * objectPatternNode = CreateNodeForOpT<knopObjectPattern>(ichMin, ichLim);
    objectPatternNode->pnode1 = pnodeMemberNodeList;
    objectPatternNode->computedCount = computedCount;
    objectPatternNode->staticCount = staticCount;
    objectPatternNode->hasRest = hasRest;
    return objectPatternNode;
}